

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::execute
          (FixVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *pDVar14;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar15;
  int iVar16;
  VarStatus VVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  long lVar21;
  long lVar22;
  cpp_dec_float<50U,_int,_void> local_2a8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_270;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  cpp_dec_float<50U,_int,_void> local_258;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8 [4];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->m_correctIdx == true) {
    iVar16 = this->m_j;
    pnVar7 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = this->m_old_j;
    *(undefined8 *)(pnVar7[iVar6].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 8);
    uVar9 = *(undefined8 *)&pnVar7[iVar16].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[iVar16].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar6].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    *(undefined8 *)&pnVar7[iVar6].m_backend.data = uVar9;
    *(undefined8 *)(pnVar7[iVar6].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar6].m_backend.exp = pnVar7[iVar16].m_backend.exp;
    pnVar7[iVar6].m_backend.neg = pnVar7[iVar16].m_backend.neg;
    iVar13 = pnVar7[iVar16].m_backend.prec_elem;
    pnVar7[iVar6].m_backend.fpclass = pnVar7[iVar16].m_backend.fpclass;
    pnVar7[iVar6].m_backend.prec_elem = iVar13;
    iVar16 = this->m_j;
    pnVar7 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = this->m_old_j;
    *(undefined8 *)(pnVar7[iVar6].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 8);
    uVar9 = *(undefined8 *)&pnVar7[iVar16].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[iVar16].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar6].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    *(undefined8 *)&pnVar7[iVar6].m_backend.data = uVar9;
    *(undefined8 *)(pnVar7[iVar6].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar6].m_backend.exp = pnVar7[iVar16].m_backend.exp;
    pnVar7[iVar6].m_backend.neg = pnVar7[iVar16].m_backend.neg;
    iVar13 = pnVar7[iVar16].m_backend.prec_elem;
    pnVar7[iVar6].m_backend.fpclass = pnVar7[iVar16].m_backend.fpclass;
    pnVar7[iVar6].m_backend.prec_elem = iVar13;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar16 = this->m_j;
  pnVar7 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 8) =
       *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
  uVar9 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
  uVar11 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
  uVar12 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
  puVar3 = pnVar7[iVar16].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
  *(undefined8 *)(puVar3 + 2) = uVar12;
  *(undefined8 *)&pnVar7[iVar16].m_backend.data = uVar9;
  *(undefined8 *)(pnVar7[iVar16].m_backend.data._M_elems + 2) = uVar11;
  pnVar7[iVar16].m_backend.exp = (this->m_val).m_backend.exp;
  pnVar7[iVar16].m_backend.neg = (this->m_val).m_backend.neg;
  iVar13 = (this->m_val).m_backend.prec_elem;
  pnVar7[iVar16].m_backend.fpclass = (this->m_val).m_backend.fpclass;
  pnVar7[iVar16].m_backend.prec_elem = iVar13;
  local_270 = cStatus;
  local_268 = y;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar21);
      pcVar19 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8.data._M_elems[9]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      pcVar20 = pcVar1;
      if ((&local_2a8 != pcVar19) && (pcVar20 = pcVar19, pcVar1 != &local_2a8)) {
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_2a8.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_2a8.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21);
        local_2a8.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 4);
        local_2a8._48_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_2a8,pcVar20)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(s->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&((this->m_col).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar21)].m_backend,&local_2a8);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x3c;
    } while (lVar22 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  pVVar15 = local_268;
  local_258.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_258.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_258.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_258.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  local_258.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_258.exp = (this->m_obj).m_backend.exp;
  local_258.neg = (this->m_obj).m_backend.neg;
  local_258.fpclass = (this->m_obj).m_backend.fpclass;
  local_258.prec_elem = (this->m_obj).m_backend.prec_elem;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar21);
      pcVar19 = &(pVVar15->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)((long)(&pNVar8->val + 1) + lVar21)].m_backend;
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8.data._M_elems[9]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      pcVar20 = pcVar1;
      if ((&local_2a8 != pcVar19) && (pcVar20 = pcVar19, pcVar1 != &local_2a8)) {
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_2a8.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_2a8.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21);
        local_2a8.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 4);
        local_2a8._48_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar21 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_2a8,pcVar20)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_258,&local_2a8);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x3c;
    } while (lVar22 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  iVar16 = this->m_j;
  pnVar18 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar18[iVar16].m_backend.data._M_elems + 8) = local_258.data._M_elems._32_8_;
  puVar3 = pnVar18[iVar16].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = local_258.data._M_elems._16_8_;
  *(undefined8 *)(puVar3 + 2) = local_258.data._M_elems._24_8_;
  *(undefined8 *)pnVar18[iVar16].m_backend.data._M_elems = local_258.data._M_elems._0_8_;
  *(undefined8 *)(pnVar18[iVar16].m_backend.data._M_elems + 2) = local_258.data._M_elems._8_8_;
  pnVar18[iVar16].m_backend.exp = local_258.exp;
  pnVar18[iVar16].m_backend.neg = local_258.neg;
  pnVar18[iVar16].m_backend.fpclass = local_258.fpclass;
  pnVar18[iVar16].m_backend.prec_elem = local_258.prec_elem;
  if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
      ((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(this->m_lower).m_backend,&(this->m_upper).m_backend), iVar16 != 0)) {
    local_168 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
    local_188 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
    uStack_180 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
    local_178 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
    uStack_170 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
    iVar16 = (this->m_val).m_backend.exp;
    bVar4 = (this->m_val).m_backend.neg;
    local_198._0_8_ = *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
    local_1b8 = *(uint (*) [2])(this->m_lower).m_backend.data._M_elems;
    auStack_1b0 = *(uint (*) [2])((this->m_lower).m_backend.data._M_elems + 2);
    local_1a8 = (this->m_lower).m_backend.data._M_elems[4];
    uStack_1a4 = (this->m_lower).m_backend.data._M_elems[5];
    uStack_1a0 = (this->m_lower).m_backend.data._M_elems[6];
    uStack_19c = (this->m_lower).m_backend.data._M_elems[7];
    iVar6 = (this->m_lower).m_backend.exp;
    local_268 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT71(local_268._1_7_,(this->m_lower).m_backend.neg);
    uVar9._0_4_ = (this->m_val).m_backend.fpclass;
    uVar9._4_4_ = (this->m_val).m_backend.prec_elem;
    uVar11._0_4_ = (this->m_lower).m_backend.fpclass;
    uVar11._4_4_ = (this->m_lower).m_backend.prec_elem;
    local_260 = &this->m_upper;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_120,this);
    local_a8 = local_188;
    uStack_a0 = uStack_180;
    local_98 = local_178;
    uStack_90 = uStack_170;
    local_88 = local_168;
    local_e8.m_backend.data._M_elems[5] = uStack_1a4;
    local_e8.m_backend.data._M_elems[4] = local_1a8;
    local_e8.m_backend.data._M_elems[7] = uStack_19c;
    local_e8.m_backend.data._M_elems[6] = uStack_1a0;
    local_e8.m_backend.data._M_elems[0] = local_1b8[0];
    local_e8.m_backend.data._M_elems[1] = local_1b8[1];
    local_e8.m_backend.data._M_elems[2] = auStack_1b0[0];
    local_e8.m_backend.data._M_elems[3] = auStack_1b0[1];
    local_e8.m_backend.data._M_elems[8] = local_198[0];
    local_e8.m_backend.data._M_elems[9] = local_198[1];
    local_e8.m_backend.neg = (bool)local_268._0_1_;
    local_e8.m_backend.exp = iVar6;
    local_e8.m_backend._48_8_ = uVar11;
    local_80 = iVar16;
    local_7c = bVar4;
    local_78 = uVar9;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_68,(soplex *)&local_a8,&local_e8,pnVar18);
    local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
    local_2a8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
    uVar9 = local_2a8.data._M_elems._0_8_;
    local_2a8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
    local_2a8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
    local_2a8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
    local_2a8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
    local_2a8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
    local_2a8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
    local_2a8.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
    local_2a8.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
    local_2a8.exp = local_68.m_backend.exp;
    local_2a8.neg = local_68.m_backend.neg;
    local_2a8.fpclass = local_68.m_backend.fpclass;
    local_2a8.prec_elem = local_68.m_backend.prec_elem;
    if ((local_68.m_backend.neg == true) &&
       (local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
       local_2a8.data._M_elems[0] != 0 || local_68.m_backend.fpclass != cpp_dec_float_finite)) {
      local_2a8.neg = false;
    }
    local_2a8.data._M_elems._0_8_ = uVar9;
    if (((local_68.m_backend.fpclass == cpp_dec_float_NaN) ||
        (local_120.fpclass == cpp_dec_float_NaN)) ||
       (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_2a8,&local_120), 0 < iVar16)) {
      local_1c8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
      local_1e8 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
      uStack_1e0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
      local_1d8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
      uStack_1d0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
      iVar16 = (this->m_val).m_backend.exp;
      bVar4 = (this->m_val).m_backend.neg;
      local_1f8._0_8_ = *(undefined8 *)((local_260->m_backend).data._M_elems + 8);
      local_218 = *(uint (*) [2])(local_260->m_backend).data._M_elems;
      auStack_210 = *(uint (*) [2])((local_260->m_backend).data._M_elems + 2);
      local_208 = (local_260->m_backend).data._M_elems[4];
      uStack_204 = (local_260->m_backend).data._M_elems[5];
      uStack_200 = (local_260->m_backend).data._M_elems[6];
      uStack_1fc = (local_260->m_backend).data._M_elems[7];
      iVar6 = (this->m_upper).m_backend.exp;
      bVar5 = (this->m_upper).m_backend.neg;
      uVar12._0_4_ = (this->m_val).m_backend.fpclass;
      uVar12._4_4_ = (this->m_val).m_backend.prec_elem;
      uVar10._0_4_ = (this->m_upper).m_backend.fpclass;
      uVar10._4_4_ = (this->m_upper).m_backend.prec_elem;
      pnVar18 = local_260;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_158,this);
      local_a8 = local_1e8;
      uStack_a0 = uStack_1e0;
      local_98 = local_1d8;
      uStack_90 = uStack_1d0;
      local_88 = local_1c8;
      local_e8.m_backend.data._M_elems[5] = uStack_204;
      local_e8.m_backend.data._M_elems[4] = local_208;
      local_e8.m_backend.data._M_elems[7] = uStack_1fc;
      local_e8.m_backend.data._M_elems[6] = uStack_200;
      local_e8.m_backend.data._M_elems[0] = local_218[0];
      local_e8.m_backend.data._M_elems[1] = local_218[1];
      local_e8.m_backend.data._M_elems[2] = auStack_210[0];
      local_e8.m_backend.data._M_elems[3] = auStack_210[1];
      local_e8.m_backend.data._M_elems[8] = local_1f8[0];
      local_e8.m_backend.data._M_elems[9] = local_1f8[1];
      local_e8.m_backend.exp = iVar6;
      local_e8.m_backend.neg = bVar5;
      local_e8.m_backend._48_8_ = uVar10;
      local_80 = iVar16;
      local_7c = bVar4;
      local_78 = uVar12;
      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_68,(soplex *)&local_a8,&local_e8,pnVar18);
      pDVar14 = local_270;
      local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
      local_2a8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
      uVar9 = local_2a8.data._M_elems._0_8_;
      local_2a8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
      local_2a8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
      local_2a8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
      local_2a8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
      local_2a8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
      local_2a8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
      local_2a8.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
      local_2a8.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
      local_2a8.exp = local_68.m_backend.exp;
      local_2a8.neg = local_68.m_backend.neg;
      local_2a8.fpclass = local_68.m_backend.fpclass;
      local_2a8.prec_elem = local_68.m_backend.prec_elem;
      if ((local_68.m_backend.neg == true) &&
         (local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
         local_2a8.data._M_elems[0] != 0 || local_68.m_backend.fpclass != cpp_dec_float_finite)) {
        local_2a8.neg = false;
      }
      VVar17 = ZERO;
      local_270 = pDVar14;
      if ((local_68.m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_158.fpclass != cpp_dec_float_NaN)) {
        local_2a8.data._M_elems._0_8_ = uVar9;
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_2a8,&local_158);
        VVar17 = (uint)(0 < iVar16) * 3;
        local_270 = pDVar14;
      }
    }
    else {
      VVar17 = ON_LOWER;
    }
  }
  else {
    VVar17 = FIXED;
  }
  local_270->data[this->m_j] = VVar17;
  return;
}

Assistant:

void SPxMainSM<R>::FixVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // update the index mapping; if m_correctIdx is false, we assume that this has happened already
   if(m_correctIdx)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   x[m_j] = m_val;

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] += m_col.value(k) * x[m_j];

   // dual:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
      val -= m_col.value(k) * y[m_col.index(k)];

   r[m_j] = val;

   // basis:
   if(m_lower == m_upper)
   {
      assert(EQrel(m_lower, m_val, this->epsilon()));

      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else
   {
      assert(EQrel(m_val, m_lower, this->epsilon()) || EQrel(m_val, m_upper, this->epsilon())
             || m_val == 0.0);

      cStatus[m_j] = EQrel(m_val, m_lower, this->epsilon()) ? SPxSolverBase<R>::ON_LOWER : (EQrel(m_val,
                     m_upper, this->epsilon()) ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ZERO);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_correctIdx)
   {
      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM19 Dimension doesn't match after this step.");
      }
   }

#endif
}